

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tri_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  REF_DBL RVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  REF_DBL RVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double local_238 [4];
  REF_DBL e1 [3];
  REF_DBL e0 [3];
  REF_DBL xyz2 [3];
  REF_DBL xyz1 [3];
  REF_DBL xyz0 [3];
  REF_DBL det;
  REF_DBL jac [9];
  REF_DBL area;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  
  if (ref_node->tri_quality == 2) {
    ref_node_metric_get_log(ref_node,*nodes,&l0);
    ref_node_metric_get_log(ref_node,nodes[1],&l1);
    ref_node_metric_get_log(ref_node,nodes[2],&l2);
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      (&det)[lVar3] = ((&l0)[lVar3] + (&l1)[lVar3] + (&l2)[lVar3]) / 3.0;
    }
    uVar2 = ref_matrix_exp_m(&det,&area);
    if (uVar2 == 0) {
      uVar2 = ref_matrix_jacob_m(&area,jac);
      if (uVar2 == 0) {
        uVar2 = ref_matrix_vect_mult(jac,ref_node->real + (long)*nodes * 0xf,xyz0);
        if (uVar2 == 0) {
          uVar2 = ref_matrix_vect_mult(jac,ref_node->real + (long)nodes[1] * 0xf,xyz1);
          if (uVar2 == 0) {
            uVar2 = ref_matrix_vect_mult(jac,ref_node->real + (long)nodes[2] * 0xf,xyz2);
            if (uVar2 == 0) {
              for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
                e0[lVar3] = xyz2[lVar3] - xyz1[lVar3];
              }
              for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
                e1[lVar3] = xyz0[lVar3] - xyz2[lVar3];
              }
              for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
                local_238[lVar3] = xyz1[lVar3] - xyz0[lVar3];
              }
              dVar8 = local_238[1] * e0[2] - e0[1] * local_238[2];
              dVar15 = local_238[2] * e0[0] - e0[2] * local_238[0];
              dVar16 = local_238[0] * e0[1] - e0[0] * local_238[1];
              dVar7 = local_238[2] * local_238[2] +
                      local_238[0] * local_238[0] + local_238[1] * local_238[1] +
                      e1[2] * e1[2] + e1[0] * e1[0] + e1[1] * e1[1] +
                      e0[2] * e0[2] + e0[0] * e0[0] + e0[1] * e0[1];
              dVar11 = dVar7 * 1e+20;
              dVar8 = SQRT(dVar16 * dVar16 + dVar8 * dVar8 + dVar15 * dVar15) * 0.5;
              auVar14._0_8_ = -dVar11;
              auVar14._8_8_ = -dVar8;
              auVar12._8_8_ = dVar8;
              auVar12._0_8_ = dVar11;
              auVar14 = maxpd(auVar12,auVar14);
              uVar6 = -(ulong)(auVar14._8_8_ < auVar14._0_8_);
              RVar9 = (REF_DBL)(~uVar6 & 0xbff0000000000000 |
                               (ulong)((dVar8 / dVar7) * 6.928203230275509) & uVar6);
LAB_0019dadb:
              *quality = RVar9;
              return 0;
            }
            uVar6 = (ulong)uVar2;
            pcVar5 = "xyz2";
            uVar4 = 0x7ed;
          }
          else {
            uVar6 = (ulong)uVar2;
            pcVar5 = "xyz1";
            uVar4 = 0x7eb;
          }
        }
        else {
          uVar6 = (ulong)uVar2;
          pcVar5 = "xyz0";
          uVar4 = 0x7e9;
        }
      }
      else {
        uVar6 = (ulong)uVar2;
        pcVar5 = "jac";
        uVar4 = 0x7e6;
      }
    }
    else {
      uVar6 = (ulong)uVar2;
      pcVar5 = "exp";
      uVar4 = 0x7e5;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_tri_jac_quality",uVar6,pcVar5);
    uVar4 = 0x809;
  }
  else {
    if (ref_node->tri_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x80c,
             "ref_node_tri_quality","case not recognized");
      return 1;
    }
    uVar2 = ref_node_ratio(ref_node,*nodes,nodes[1],&l0);
    if (uVar2 == 0) {
      uVar2 = ref_node_ratio(ref_node,*nodes,nodes[2],&l1);
      if (uVar2 == 0) {
        uVar2 = ref_node_ratio(ref_node,nodes[1],nodes[2],&l2);
        if (uVar2 == 0) {
          uVar2 = ref_node_tri_area(ref_node,nodes,&area);
          if (uVar2 == 0) {
            ref_node_metric_get(ref_node,*nodes,jac);
            uVar2 = ref_matrix_det_m(jac,&det);
            RVar9 = det;
            if (uVar2 == 0) {
              ref_node_metric_get(ref_node,nodes[1],jac);
              uVar2 = ref_matrix_det_m(jac,&det);
              RVar1 = det;
              if (uVar2 == 0) {
                ref_node_metric_get(ref_node,nodes[2],jac);
                uVar2 = ref_matrix_det_m(jac,&det);
                if (uVar2 == 0) {
                  if (RVar1 <= RVar9) {
                    RVar9 = RVar1;
                  }
                  if (det <= RVar9) {
                    RVar9 = det;
                  }
                  dVar7 = pow(RVar9,0.3333333333333333);
                  dVar11 = l2 * l2 + l0 * l0 + l1 * l1;
                  dVar8 = dVar11 * 1e+20;
                  dVar7 = area * dVar7;
                  auVar10._0_8_ = -dVar8;
                  auVar10._8_8_ = -dVar7;
                  auVar13._8_8_ = dVar7;
                  auVar13._0_8_ = dVar8;
                  auVar14 = maxpd(auVar13,auVar10);
                  uVar6 = -(ulong)(auVar14._8_8_ < auVar14._0_8_);
                  RVar9 = (REF_DBL)(~uVar6 & 0xbff0000000000000 |
                                   (ulong)((dVar7 * 6.9282032302755105) / dVar11) & uVar6);
                  goto LAB_0019dadb;
                }
                uVar6 = (ulong)uVar2;
                pcVar5 = "n2";
                uVar4 = 0x7c5;
              }
              else {
                uVar6 = (ulong)uVar2;
                pcVar5 = "n1";
                uVar4 = 0x7c1;
              }
            }
            else {
              uVar6 = (ulong)uVar2;
              pcVar5 = "n0";
              uVar4 = 0x7bd;
            }
          }
          else {
            uVar6 = (ulong)uVar2;
            pcVar5 = "area";
            uVar4 = 0x7ba;
          }
        }
        else {
          uVar6 = (ulong)uVar2;
          pcVar5 = "l2";
          uVar4 = 0x7b8;
        }
      }
      else {
        uVar6 = (ulong)uVar2;
        pcVar5 = "l1";
        uVar4 = 0x7b7;
      }
    }
    else {
      uVar6 = (ulong)uVar2;
      pcVar5 = "l0";
      uVar4 = 0x7b6;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_tri_epic_quality",uVar6,pcVar5);
    uVar4 = 0x806;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_tri_quality",uVar6,"epic");
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_quality(ref_node, nodes, quality), "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}